

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ctl.c
# Opt level: O0

int gost_set_default_param(int param,char *value)

{
  char *pcVar1;
  char *in_RSI;
  int in_EDI;
  char *tmp;
  char *local_18;
  int local_4;
  
  if ((in_EDI < 0) || (2 < in_EDI)) {
    local_4 = 0;
  }
  else {
    local_18 = getenv(gost_envnames[in_EDI]);
    if (local_18 == (char *)0x0) {
      local_18 = in_RSI;
    }
    CRYPTO_free(gost_params[in_EDI]);
    pcVar1 = CRYPTO_strdup(local_18,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ctl.c"
                           ,0x4a);
    gost_params[in_EDI] = pcVar1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int gost_set_default_param(int param, const char *value)
{
    const char *tmp;
    if (param < 0 || param >= GOST_PARAM_MAX)
        return 0;
    tmp = getenv(gost_envnames[param]);

    /*
     * if there is value in the environment, use it, else -passed string *
     */
    if (!tmp) {
        tmp = value;
    }
    OPENSSL_free(gost_params[param]);
    gost_params[param] = BUF_strdup(tmp);

    return 1;
}